

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.c
# Opt level: O3

int makeDots(float radius,point3d *points,int maxpnts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  double dStack_80;
  
  dVar16 = (double)maxpnts * 3.14159265359;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  dVar16 = floor(dVar16);
  iVar11 = (int)dVar16;
  iVar10 = 0;
  if (-2 < iVar11) {
    bVar8 = true;
    lVar14 = 0;
    iVar9 = 0;
    do {
      dVar16 = ((double)iVar9 * 3.14159265359) / (double)(iVar11 / 2);
      dVar3 = cos(dVar16);
      dVar3 = dVar3 * (double)radius;
      dVar4 = sin(dVar16);
      dVar4 = dVar4 * (double)radius;
      dVar16 = sin(dVar16);
      dVar16 = floor(dVar16 * (double)iVar11);
      iVar7 = (int)dVar16;
      if ((int)dVar16 < 2) {
        iVar7 = 1;
      }
      dVar16 = dVar3 * -0.043619387365338866;
      dVar3 = dVar3 * 0.9990482215818577;
      auVar1._8_4_ = SUB84(dVar3,0);
      auVar1._0_8_ = dVar16;
      auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
      iVar10 = (int)lVar14;
      lVar14 = (long)iVar10;
      pdVar12 = &points[lVar14].y;
      dVar3 = 0.0;
      iVar13 = 0;
      do {
        dVar6 = dVar3 * 6.28318530718;
        if (bVar8) {
          dVar6 = dVar3 * 6.28318530718 + 0.20000000298023224;
        }
        dVar5 = cos(dVar6 / (double)iVar7);
        dVar6 = sin(dVar6 / (double)iVar7);
        if (maxpnts <= lVar14) goto LAB_001229d8;
        dVar6 = dVar6 * dVar4;
        ((point3d *)(pdVar12 + -1))->x = dVar5 * dVar4;
        dStack_80 = auVar1._8_8_;
        dStack_80 = dVar6 * 0.043619387365338866 + dStack_80;
        auVar2._8_4_ = SUB84(dStack_80,0);
        auVar2._0_8_ = dVar6 * 0.9990482215818577 + dVar16;
        auVar2._12_4_ = (int)((ulong)dStack_80 >> 0x20);
        *(undefined1 (*) [16])pdVar12 = auVar2;
        lVar14 = lVar14 + 1;
        dVar3 = dVar3 + 1.0;
        iVar13 = iVar13 + -1;
        pdVar12 = pdVar12 + 3;
      } while (-iVar7 != iVar13);
      bVar8 = (bool)(bVar8 ^ 1);
      bVar15 = iVar9 != iVar11 / 2;
      iVar9 = iVar9 + 1;
    } while (bVar15);
LAB_001229d8:
    iVar10 = iVar10 - iVar13;
  }
  return iVar10;
}

Assistant:

int makeDots(float radius, point3d points[], int maxpnts) {
   float offset = 0.2;
   double ang, cosang, sinang, phi, theta, xy0, x0, y0, z0;
   int i, j, k, odd, nequator, nvert, nhoriz;

   nequator = (int)floor(sqrt(maxpnts * PI));

   odd = 1;
   ang = 5.0 * PI / 360.0;
   cosang = cos(ang);
   sinang = sin(ang);

   i = 0;
   nvert = nequator / 2;
   for (j = 0; j <= nvert; j++) {
      phi = (PI * j) / nvert;
      z0 = cos(phi) * radius;
      xy0= sin(phi) * radius;

      nhoriz = (int)floor(nequator * sin(phi));
      if (nhoriz < 1) nhoriz = 1;
      for (k = 0; k < nhoriz; k++) {
	 if(odd) {theta = (2.0 * PI * k + offset)/nhoriz; }
	 else    {theta = (2.0 * PI * k         )/nhoriz; }
	 x0 = cos(theta) * xy0;
	 y0 = sin(theta) * xy0;

	 if (i >= maxpnts) return i;
	 points[i].x = x0;
	 points[i].y = y0*cosang - z0*sinang;
	 points[i].z = y0*sinang + z0*cosang;
	 i++;
      }
      odd = !odd;
   }
   return i;
}